

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

string * escape_string(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (s->_M_dataplus)._M_p;
  pcVar4 = pcVar2;
  do {
    if (pcVar4 == pcVar2 + s->_M_string_length) {
      return __return_storage_ptr__;
    }
    cVar3 = *pcVar4;
    switch(cVar3) {
    case '\b':
      break;
    case '\t':
      break;
    case '\n':
      break;
    case '\v':
    case '\f':
switchD_00157f46_caseD_b:
      iVar1 = isprint((int)cVar3);
      if (iVar1 == 0) {
        cVar3 = (char)__return_storage_ptr__;
        std::__cxx11::string::push_back(cVar3);
        std::__cxx11::string::push_back(cVar3);
        std::__cxx11::string::push_back(cVar3);
        std::__cxx11::string::push_back(cVar3);
      }
      else {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)local_50);
      }
      goto LAB_00157fdc;
    case '\r':
      break;
    default:
      if (((cVar3 != '\"') && (cVar3 != '\'')) && (cVar3 != '\\')) goto switchD_00157f46_caseD_b;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00157fdc:
    pcVar4 = pcVar4 + 1;
    pcVar2 = (s->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

inline std::string escape_string(const std::string &s) {
    const char *hex_digits = "0123456789abcdef";
    std::string result;

    for (auto it = s.begin(); it != s.end(); ++it) {
        char ch = *it;

        if (ch == '\\') {
            result += "\\\\";
        } else if (ch == '\'') {
            result += "\\\'";
        } else if (ch == '\"') {
            result += "\\\"";
        } else if (ch == '\b') {
            result += "\\b";
        } else if (ch == '\t') {
            result += "\\t";
        } else if (ch == '\r') {
            result += "\\r";
        } else if (ch == '\n') {
            result += "\\n";
        } else if (std::isprint(ch)) {
            result += std::string(1, ch);
        } else {
            result.push_back('\\');
            result.push_back('x');
            result.push_back(hex_digits[static_cast<unsigned char>(ch) / 16]);
            result.push_back(hex_digits[static_cast<unsigned char>(ch) % 16]);
        }
    }

    return result;
}